

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

Weight ON_Font::WeightFromAppleFontWeightTrait(double apple_font_weight_trait)

{
  bool bVar1;
  undefined8 local_30;
  undefined4 local_24;
  int windows_logfont_weight;
  double x;
  double apple_font_weight_trait_local;
  
  bVar1 = ON_IsValid(apple_font_weight_trait);
  if (bVar1) {
    if ((apple_font_weight_trait < -1.0) ||
       (local_30 = apple_font_weight_trait, 1.0 < apple_font_weight_trait)) {
      local_30 = 0.0;
    }
    local_24 = (int)(local_30 * 750.0 + 400.0);
    if (local_24 < 1) {
      local_24 = 1;
    }
    else if (1000 < local_24) {
      local_24 = 1000;
    }
    apple_font_weight_trait_local._7_1_ = WeightFromWindowsLogfontWeight(local_24);
  }
  else {
    apple_font_weight_trait_local._7_1_ = Unset;
  }
  return apple_font_weight_trait_local._7_1_;
}

Assistant:

ON_Font::Weight ON_Font::WeightFromAppleFontWeightTrait(
  double apple_font_weight_trait
)
{
  if (false == ON_IsValid(apple_font_weight_trait))
    return ON_Font::Weight::Unset;

  const double x = (-1.0 <= apple_font_weight_trait && apple_font_weight_trait <= 1.0) ? apple_font_weight_trait : 0.0;
  int windows_logfont_weight = (int)(400.0 + 750.0*x);
  if (windows_logfont_weight < 1)
    windows_logfont_weight = 1;
  else if (windows_logfont_weight > 1000)
    windows_logfont_weight = 1000;
  return ON_Font::WeightFromWindowsLogfontWeight(windows_logfont_weight);
}